

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImDrawChannel *
ImVector_ImDrawChannel_ImVector_ImDrawChannelVector(ImVector_ImDrawChannel *src)

{
  uint uVar1;
  ImVector_ImDrawChannel *pIVar2;
  ImDrawChannel *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImDrawChannel *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImDrawChannel *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImDrawChannel *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImDrawChannel *)ImGui::MemAlloc(uVar3 << 5);
    if (pIVar2->Data != (ImDrawChannel *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 5);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 << 5);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImDrawChannel* ImVector_ImDrawChannel_ImVector_ImDrawChannelVector(const ImVector_ImDrawChannel src)
{
    return IM_NEW(ImVector_ImDrawChannel)(src);
}